

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

void __thiscall Memory::allocate_memory(Memory *this,size_t mem_size)

{
  uint __line;
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  int *piVar3;
  string local_68;
  string local_48;
  char *local_28;
  char *target;
  
  this->size = mem_size;
  local_28 = (char *)0x0;
  if (this->superpage != true) {
    iVar1 = posix_memalign(&local_28,0x40000000,0x40000000);
    if (iVar1 == 0) {
      iVar1 = madvise(local_28,0x40000000,0xe);
      if (iVar1 == 0) {
        memset(local_28,0x41,0x40000000);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"Waiting for khugepaged.",(allocator<char> *)&local_68);
        Logger::log_info(&local_48,true);
        std::__cxx11::string::~string((string *)&local_48);
        sleep(10);
        pcVar2 = local_28;
        goto LAB_0013b14a;
      }
      pcVar2 = "madvise((void *) target, MEM_SIZE, MADV_HUGEPAGE)==0";
      __line = 0x1d;
    }
    else {
      pcVar2 = "posix_memalign((void **) &target, MEM_SIZE, MEM_SIZE)==0";
      __line = 0x1c;
    }
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/src/Memory/Memory.cpp"
                  ,__line,"void Memory::allocate_memory(size_t)");
  }
  __stream = fopen((this->hugetlbfs_mountpoint)._M_dataplus._M_p,"w+");
  if (__stream == (FILE *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Could not mount superpage from %s. Error:",
               (allocator<char> *)((long)&target + 7));
    format_string<char_const*>(&local_48,&local_68,(this->hugetlbfs_mountpoint)._M_dataplus._M_p);
    Logger::log_info(&local_48,true);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,pcVar2,(allocator<char> *)&local_68);
    Logger::log_data(&local_48,true);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    pcVar2 = this->start_address;
    iVar1 = fileno(__stream);
    pcVar2 = (char *)mmap(pcVar2,0x40000000,3,0x78040021,iVar1,0);
    if (pcVar2 != (char *)0xffffffffffffffff) {
LAB_0013b14a:
      local_28 = pcVar2;
      if (local_28 != this->start_address) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"Could not create mmap area at address %p, instead using %p."
                   ,(allocator<char> *)((long)&target + 7));
        format_string<char_volatile*,char_volatile*>
                  (&local_48,&local_68,this->start_address,local_28);
        Logger::log_error(&local_48,true);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        this->start_address = local_28;
      }
      initialize(this,RANDOM);
      return;
    }
    perror("mmap");
  }
  exit(1);
}

Assistant:

void Memory::allocate_memory(size_t mem_size) {
  this->size = mem_size;
  volatile char *target = nullptr;
  FILE *fp;

  if (superpage) {
    // allocate memory using super pages
    fp = fopen(hugetlbfs_mountpoint.c_str(), "w+");
    if (fp==nullptr) {
      Logger::log_info(format_string("Could not mount superpage from %s. Error:", hugetlbfs_mountpoint.c_str()));
      Logger::log_data(std::strerror(errno));
      exit(EXIT_FAILURE);
    }
    auto mapped_target = mmap((void *) start_address, MEM_SIZE, PROT_READ | PROT_WRITE,
        MAP_SHARED | MAP_ANONYMOUS | MAP_HUGETLB | (30UL << MAP_HUGE_SHIFT), fileno(fp), 0);
    if (mapped_target==MAP_FAILED) {
      perror("mmap");
      exit(EXIT_FAILURE);
    }
    target = (volatile char*) mapped_target;
  } else {
    // allocate memory using huge pages
    assert(posix_memalign((void **) &target, MEM_SIZE, MEM_SIZE)==0);
    assert(madvise((void *) target, MEM_SIZE, MADV_HUGEPAGE)==0);
    memset((char *) target, 'A', MEM_SIZE);
    // for khugepaged
    Logger::log_info("Waiting for khugepaged.");
    sleep(10);
  }

  if (target!=start_address) {
    Logger::log_error(format_string("Could not create mmap area at address %p, instead using %p.",
        start_address, target));
    start_address = target;
  }

  // initialize memory with random but reproducible sequence of numbers
  initialize(DATA_PATTERN::RANDOM);
}